

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::trimLeft
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *charSet)

{
  size_t sVar1;
  size_t in_RSI;
  StringRef *in_RDI;
  size_t i;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffff8;
  
  sVar1 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::findNotOneOf
                    (in_stack_fffffffffffffff8,in_RDI,in_RSI);
  if (sVar1 == 0xffffffffffffffff) {
    clear((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0xffffffffffffffff);
    sVar1 = 0;
  }
  else {
    in_RDI->m_p = in_RDI->m_p + sVar1;
    in_RDI->m_length = in_RDI->m_length - sVar1;
    sVar1 = in_RDI->m_length;
  }
  return sVar1;
}

Assistant:

size_t
	trimLeft(const StringRef& charSet) {
		size_t i = this->findNotOneOf(charSet);
		if (i == -1) {
			clear();
			return 0;
		}

		this->m_p += i;
		this->m_length -= i;
		return this->m_length;
	}